

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecClass.c
# Opt level: O2

int Cec_ManSimCompareEqual(uint *p0,uint *p1,int nWords)

{
  uint *puVar1;
  uint *puVar2;
  ulong uVar3;
  ulong uVar4;
  
  uVar3 = 0;
  if (0 < nWords) {
    uVar3 = (ulong)(uint)nWords;
  }
  uVar4 = 0;
  if (((*p1 ^ *p0) & 1) == 0) {
    do {
      if (uVar3 == uVar4) {
        return 1;
      }
      puVar1 = p0 + uVar4;
      puVar2 = p1 + uVar4;
      uVar4 = uVar4 + 1;
    } while (*puVar1 == *puVar2);
  }
  else {
    do {
      if (uVar3 == uVar4) {
        return 1;
      }
      puVar1 = p1 + uVar4;
      puVar2 = p0 + uVar4;
      uVar4 = uVar4 + 1;
    } while ((*puVar1 ^ *puVar2) == 0xffffffff);
  }
  return 0;
}

Assistant:

int Cec_ManSimCompareEqual( unsigned * p0, unsigned * p1, int nWords )
{
    int w;
    if ( (p0[0] & 1) == (p1[0] & 1) )
    {
        for ( w = 0; w < nWords; w++ )
            if ( p0[w] != p1[w] )
                return 0;
        return 1;
    }
    else
    {
        for ( w = 0; w < nWords; w++ )
            if ( p0[w] != ~p1[w] )
                return 0;
        return 1;
    }
}